

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_insert.cpp
# Opt level: O0

unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true> __thiscall
duckdb::PhysicalInsert::GetGlobalSinkState(PhysicalInsert *this,ClientContext *context)

{
  CatalogTransaction transaction;
  bool bVar1;
  SchemaCatalogEntry *pSVar2;
  TableCatalogEntry *pTVar3;
  ClientContext *in_RDX;
  PhysicalOperator *in_RSI;
  BoundCreateTableInfo *in_RDI;
  templated_unique_single_t result;
  Catalog *catalog;
  optional_ptr<duckdb::TableCatalogEntry,_true> table;
  ClientContext *in_stack_ffffffffffffff28;
  CatalogEntry *in_stack_ffffffffffffff30;
  DuckTableEntry *in_stack_ffffffffffffff48;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffff50;
  _Head_base<0UL,_duckdb::GlobalSinkState_*,_false> schema;
  optional_ptr<duckdb::TableCatalogEntry,_true> local_68;
  ClientContext *in_stack_ffffffffffffffa0;
  CatalogEntry *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  DuckTableEntry *in_stack_ffffffffffffffc0;
  optional_ptr<duckdb::TableCatalogEntry,_true> local_30;
  Catalog *local_28;
  optional_ptr<duckdb::TableCatalogEntry,_true> local_20;
  ClientContext *local_18;
  
  schema._M_head_impl = (GlobalSinkState *)in_RDI;
  local_18 = in_RDX;
  optional_ptr<duckdb::TableCatalogEntry,_true>::optional_ptr(&local_20);
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
                      *)0x186e1f7);
  if (bVar1) {
    pSVar2 = optional_ptr<duckdb::SchemaCatalogEntry,_true>::operator->
                       ((optional_ptr<duckdb::SchemaCatalogEntry,_true> *)in_stack_ffffffffffffff30)
    ;
    local_28 = (pSVar2->super_InCatalogEntry).catalog;
    Catalog::GetCatalogTransaction((Catalog *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    optional_ptr<duckdb::SchemaCatalogEntry,_true>::get_mutable
              ((optional_ptr<duckdb::SchemaCatalogEntry,_true> *)&in_RSI[1].estimated_cardinality);
    in_stack_ffffffffffffff28 = in_stack_ffffffffffffffa0;
    in_stack_ffffffffffffff48 = in_stack_ffffffffffffffc0;
    unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
    ::operator*((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                 *)in_stack_ffffffffffffff30);
    in_stack_ffffffffffffff30 = in_stack_ffffffffffffffa8;
    transaction.context.ptr = (ClientContext *)in_stack_ffffffffffffff30;
    transaction.db.ptr = (DatabaseInstance *)in_stack_ffffffffffffff28;
    transaction.transaction.ptr = (Transaction *)in_stack_ffffffffffffffb0;
    transaction.transaction_id = in_stack_ffffffffffffffb8;
    transaction.start_time = (transaction_t)in_stack_ffffffffffffff48;
    Catalog::CreateTable
              ((Catalog *)in_RSI,transaction,(SchemaCatalogEntry *)schema._M_head_impl,in_RDI);
    optional_ptr<duckdb::CatalogEntry,_true>::operator->
              ((optional_ptr<duckdb::CatalogEntry,_true> *)in_stack_ffffffffffffff30);
    pTVar3 = CatalogEntry::Cast<duckdb::TableCatalogEntry>(in_stack_ffffffffffffff30);
    optional_ptr<duckdb::TableCatalogEntry,_true>::optional_ptr(&local_30,pTVar3);
    local_20.ptr = local_30.ptr;
  }
  else {
    pTVar3 = optional_ptr<duckdb::TableCatalogEntry,_true>::get_mutable
                       ((optional_ptr<duckdb::TableCatalogEntry,_true> *)(in_RSI + 1));
    optional_ptr<duckdb::TableCatalogEntry,_true>::optional_ptr(&local_68,pTVar3);
    local_20.ptr = local_68.ptr;
  }
  PhysicalOperator::GetTypes(in_RSI);
  optional_ptr<duckdb::TableCatalogEntry,_true>::operator->
            ((optional_ptr<duckdb::TableCatalogEntry,_true> *)in_stack_ffffffffffffff30);
  CatalogEntry::Cast<duckdb::DuckTableEntry>(in_stack_ffffffffffffff30);
  make_uniq<duckdb::InsertGlobalState,duckdb::ClientContext&,duckdb::vector<duckdb::LogicalType,true>const&,duckdb::DuckTableEntry&>
            (local_18,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  unique_ptr<duckdb::GlobalSinkState,std::default_delete<duckdb::GlobalSinkState>,true>::
  unique_ptr<duckdb::InsertGlobalState,std::default_delete<std::unique_ptr<duckdb::GlobalSinkState,std::default_delete<duckdb::GlobalSinkState>>>,void>
            ((unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
              *)in_stack_ffffffffffffff30,
             (unique_ptr<duckdb::InsertGlobalState,_std::default_delete<duckdb::InsertGlobalState>_>
              *)in_stack_ffffffffffffff28);
  unique_ptr<duckdb::InsertGlobalState,_std::default_delete<duckdb::InsertGlobalState>,_true>::
  ~unique_ptr((unique_ptr<duckdb::InsertGlobalState,_std::default_delete<duckdb::InsertGlobalState>,_true>
               *)0x186e36e);
  return (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)
         (_Tuple_impl<0UL,_duckdb::GlobalSinkState_*,_std::default_delete<duckdb::GlobalSinkState>_>
         )schema._M_head_impl;
}

Assistant:

unique_ptr<GlobalSinkState> PhysicalInsert::GetGlobalSinkState(ClientContext &context) const {
	optional_ptr<TableCatalogEntry> table;
	if (info) {
		// CREATE TABLE AS
		D_ASSERT(!insert_table);
		auto &catalog = schema->catalog;
		table = &catalog.CreateTable(catalog.GetCatalogTransaction(context), *schema.get_mutable(), *info)
		             ->Cast<TableCatalogEntry>();
	} else {
		D_ASSERT(insert_table);
		D_ASSERT(insert_table->IsDuckTable());
		table = insert_table.get_mutable();
	}
	auto result = make_uniq<InsertGlobalState>(context, GetTypes(), table->Cast<DuckTableEntry>());
	return std::move(result);
}